

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

int Aig_ManCheckAcyclic(Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pNode;
  Aig_Man_t *pAVar3;
  uint i;
  
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  i = 0;
  while( true ) {
    if (p->vCos->nSize <= (int)i) {
      return 1;
    }
    pvVar2 = Vec_PtrEntry(p->vCos,i);
    pNode = (Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
    if ((pNode->TravId != p->nTravIds + -1) &&
       (pAVar3 = p, iVar1 = Aig_ManCheckAcyclic_rec(p,pNode,fVerbose), iVar1 == 0)) break;
    i = i + 1;
  }
  if (fVerbose != 0) {
    Abc_Print((int)pAVar3," CO %d\n",(ulong)i);
    return 0;
  }
  return 0;
}

Assistant:

int Aig_ManCheckAcyclic( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Aig_ManIncrementTravId( p );   
    Aig_ManIncrementTravId( p );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Aig_ManForEachCo( p, pNode, i )
    {
        pNode = Aig_ObjFanin0(pNode);
        if ( Aig_ObjIsTravIdPrevious(p, pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pNode, fVerbose)) )
            continue;
        // stop as soon as the first loop is detected
        if ( fVerbose )
        Abc_Print( 1, " CO %d\n", i );
        break;
    }
    return fAcyclic;
}